

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O0

void __thiscall
JointPolicyPureVector::JointPolicyPureVector
          (JointPolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu)

{
  undefined4 uVar1;
  long *in_RSI;
  JointPolicyDiscretePure *in_RDI;
  
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  JointPolicyDiscretePure::JointPolicyDiscretePure(in_RDI,in_RSI,uVar1);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(in_RDI + 0x38),in_RSI,uVar1,999999);
  *(code **)in_RDI = ValueFunctionDecPOMDPDiscrete::CalculateV<false>;
  *(code **)(in_RDI + 0x38) = DecPOMDPDiscrete::CreateNewRewardModel;
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::vector
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)0x123cfd);
  return;
}

Assistant:

JointPolicyPureVector(const Interface_ProblemToPolicyDiscretePure* pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}